

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_cond_move(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 c2;
  TCGv_i64 t_00;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rt_local;
  int rs_local;
  int rd_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (rd != 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,rt);
    c2 = tcg_const_i64_mips64el(tcg_ctx_00,0);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t_00,rs);
    if (opc == 10) {
      tcg_gen_movcond_i64_mips64el
                (tcg_ctx_00,TCG_COND_EQ,tcg_ctx_00->cpu_gpr[rd],t,c2,t_00,tcg_ctx_00->cpu_gpr[rd]);
    }
    else if (opc == 0xb) {
      tcg_gen_movcond_i64_mips64el
                (tcg_ctx_00,TCG_COND_NE,tcg_ctx_00->cpu_gpr[rd],t,c2,t_00,tcg_ctx_00->cpu_gpr[rd]);
    }
    else if (opc == 0x35) {
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,tcg_ctx_00->cpu_gpr[rd],t,c2,t_00,c2);
    }
    else if (opc == 0x37) {
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,tcg_ctx_00->cpu_gpr[rd],t,c2,t_00,c2);
    }
    tcg_temp_free_i64(tcg_ctx_00,t_00);
    tcg_temp_free_i64(tcg_ctx_00,c2);
    tcg_temp_free_i64(tcg_ctx_00,t);
  }
  return;
}

Assistant:

static void gen_cond_move(DisasContext *ctx, uint32_t opc,
                          int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1, t2;

    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rt);
    t1 = tcg_const_tl(tcg_ctx, 0);
    t2 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t2, rs);
    switch (opc) {
    case OPC_MOVN:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_gpr[rd], t0, t1, t2, tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_MOVZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_gpr[rd], t0, t1, t2, tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_SELNEZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_gpr[rd], t0, t1, t2, t1);
        break;
    case OPC_SELEQZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_gpr[rd], t0, t1, t2, t1);
        break;
    }
    tcg_temp_free(tcg_ctx, t2);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);
}